

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O3

bool __thiscall
Diligent::DearchiverBase::UnpackPSOShaders<Diligent::ComputePipelineStateCreateInfo>
          (DearchiverBase *this,ArchiveData *Archive,
          PSOData<Diligent::ComputePipelineStateCreateInfo> *PSO,IRenderDevice *pDevice)

{
  RefCntAutoPtr<Diligent::IShader> *this_00;
  pointer pRVar1;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *this_01;
  bool bVar2;
  DeviceType DevType;
  SerializedData *pSVar3;
  pointer pRVar4;
  mutex *Args_1;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  long lVar7;
  ulong Idx;
  ulong uVar8;
  Serializer<(Diligent::SerializerMode)0> Ser;
  ShaderIndexArray ShaderIndices;
  string msg;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  DynamicLinearAllocator Allocator;
  string local_188;
  ulong local_168;
  ulong local_160;
  ConstQual<ShaderIndexArray> local_158;
  undefined1 local_148 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_128;
  char *local_120;
  ShaderMacro *local_118;
  Uint32 local_110;
  DeviceObjectAttribs local_108;
  SHADER_TYPE local_100;
  Bool local_fc;
  char *local_f8;
  undefined8 local_f0;
  ShaderVersion SStack_e8;
  ShaderVersion SStack_e0;
  ShaderVersion SStack_d8;
  undefined1 auStack_d0 [5];
  ulong uStack_cb;
  char *local_c0;
  char *pcStack_b8;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *local_b0;
  PSOData<Diligent::ComputePipelineStateCreateInfo> *local_a8;
  IRenderDevice *local_a0;
  ArchiveData *local_98;
  DearchiverBase *local_90;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *local_88;
  RefCntAutoPtr<Diligent::IShader> *local_80;
  pointer local_78;
  Serializer<(Diligent::SerializerMode)0> local_70;
  DynamicLinearAllocator local_58;
  
  local_90 = this;
  if ((Archive->pObjArchive)._M_t.
      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl ==
      (DeviceObjectArchive *)0x0) {
    FormatString<char[26],char[12]>
              ((string *)local_148,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pObjArchive",(char (*) [12])pDevice);
    DebugAssertionFailed
              ((Char *)local_148._0_8_,"UnpackPSOShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x19d);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
    }
  }
  DevType = GetArchiveDeviceType(pDevice);
  pSVar3 = DeviceObjectArchive::GetDeviceSpecificData
                     ((Archive->pObjArchive)._M_t.
                      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                      _M_head_impl,ComputePipeline,
                      (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.
                      super_DeviceObjectAttribs.Name,DevType);
  if (pSVar3->m_Ptr == (void *)0x0) {
    bVar2 = false;
  }
  else {
    local_58.m_pAllocator = GetRawAllocator();
    local_58.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.m_BlockSize = 0x1000;
    local_158.pIndices = (Uint32 *)0x0;
    local_158.Count = 0;
    local_188._M_dataplus._M_p = (pointer)pSVar3->m_Ptr;
    local_188._M_string_length =
         (size_type)
         ((((mutex *)local_188._M_dataplus._M_p)->super___mutex_base)._M_mutex.__size +
         pSVar3->m_Size);
    local_188.field_2._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    bVar2 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                      ((Serializer<(Diligent::SerializerMode)0> *)&local_188,&local_158,&local_58);
    if (bVar2) {
      if (local_188.field_2._M_allocated_capacity != local_188._M_string_length) {
        FormatString<char[49]>
                  ((string *)local_148,
                   (char (*) [49])"No other data besides shader indices is expected");
        DebugAssertionFailed
                  ((Char *)local_148._0_8_,"UnpackPSOShaders",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                   ,0x1ad);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
      }
      local_88 = &PSO->Shaders;
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
      ::resize(local_88,(ulong)local_158.Count);
      bVar2 = true;
      if (local_158.Count != 0) {
        Args_1 = &(Archive->CachedShaders)._M_elems[DevType].Mtx;
        local_b0 = &(Archive->CachedShaders)._M_elems[DevType].Shaders;
        lVar7 = 0;
        uVar8 = 0;
        local_a8 = PSO;
        local_a0 = pDevice;
        local_98 = Archive;
        do {
          pRVar1 = (local_88->
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          Idx = (ulong)local_158.pIndices[uVar8];
          local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
          local_168 = uVar8;
          local_148._0_8_ = Args_1;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_148);
          this_00 = (RefCntAutoPtr<Diligent::IShader> *)((long)&pRVar1->m_pObject + lVar7);
          local_148[8] = 1;
          pRVar4 = (Archive->CachedShaders)._M_elems[DevType].Shaders.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((Idx < (ulong)((long)(Archive->CachedShaders)._M_elems[DevType].Shaders.
                                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3))
             && (RefCntAutoPtr<Diligent::IShader>::operator=(this_00,pRVar4[Idx].m_pObject),
                pRVar1[local_168].m_pObject != (IShader *)0x0)) {
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_148);
            uVar8 = local_168;
          }
          else {
            local_80 = this_00;
            local_78 = pRVar1;
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_148);
            local_160 = Idx;
            pSVar3 = DeviceObjectArchive::GetSerializedShader
                               ((local_98->pObjArchive)._M_t.
                                super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                                .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>
                                ._M_head_impl,DevType,Idx);
            if (pSVar3->m_Ptr == (void *)0x0) goto LAB_0046f9f4;
            local_148._16_8_ = (mutex *)0x0;
            local_148._24_8_ = 0;
            local_148._0_8_ = (mutex *)0x0;
            local_148._8_8_ = (IShaderSourceInputStreamFactory *)0x0;
            local_128.SourceLength = 0;
            local_120 = "main";
            local_118 = (ShaderMacro *)0x0;
            local_110 = 0;
            local_108.Name = (Char *)0x0;
            local_100 = SHADER_TYPE_UNKNOWN;
            local_fc = false;
            local_f8 = "_sampler";
            auStack_d0 = (undefined1  [5])0x0;
            uStack_cb = 0;
            SStack_e0.Major = 0;
            SStack_e0.Minor = 0;
            SStack_d8._0_5_ = 0;
            SStack_d8.Minor._1_3_ = 0;
            local_f0._0_4_ = SHADER_SOURCE_LANGUAGE_DEFAULT;
            local_f0._4_4_ = SHADER_COMPILER_DEFAULT;
            SStack_e8.Major = 0;
            SStack_e8.Minor = 0;
            local_c0 = (char *)0x0;
            pcStack_b8 = (char *)0x0;
            local_70.m_Start = (TPointer)pSVar3->m_Ptr;
            local_70.m_End = local_70.m_Start + pSVar3->m_Size;
            local_70.m_Ptr = local_70.m_Start;
            bVar2 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                              (&local_70,(ConstQual<ShaderCreateInfo> *)local_148);
            pRVar1 = local_78;
            uVar8 = local_168;
            if (!bVar2) {
              FormatString<char[84]>
                        (&local_188,
                         (char (*) [84])
                         "Failed to deserialize shader create info. Archive file may be corrupted or invalid."
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,local_188._M_dataplus._M_p,0,0,0);
              }
              uVar5 = local_188.field_2._M_allocated_capacity;
              _Var6._M_p = local_188._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_0046f9ec;
              goto LAB_0046f9f4;
            }
            if (local_70.m_Ptr != local_70.m_End) {
              FormatString<char[26],char[20]>
                        (&local_188,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"ShaderSer.IsEnded()",(char (*) [20])Args_1);
              DebugAssertionFailed
                        (local_188._M_dataplus._M_p,"UnpackPSOShaders",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                         ,0x1d1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                (ulong)(local_188.field_2._M_allocated_capacity + 1));
              }
            }
            if (((local_a8->InternalCI).Flags & PSO_CREATE_INTERNAL_FLAG_LAST) !=
                PSO_CREATE_INTERNAL_FLAG_NONE) {
              uStack_cb = uStack_cb | 0x2000000;
            }
            (*(local_90->super_ObjectBase<Diligent::IDearchiver>).
              super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject.
              _vptr_IObject[0xf])(&local_188,local_90,local_148,local_a0);
            RefCntAutoPtr<Diligent::IShader>::operator=
                      (local_80,(RefCntAutoPtr<Diligent::IShader> *)&local_188);
            if ((mutex *)local_188._M_dataplus._M_p != (mutex *)0x0) {
              (**(code **)(*(long *)local_188._M_dataplus._M_p + 0x10))();
            }
            this_01 = local_b0;
            if (pRVar1[uVar8].m_pObject == (IShader *)0x0) goto LAB_0046f9f4;
            local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
            local_148._0_8_ = Args_1;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_148);
            local_148[8] = 1;
            pRVar4 = (Archive->CachedShaders)._M_elems[DevType].Shaders.
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(Archive->CachedShaders)._M_elems[DevType].Shaders.
                              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3) <=
                local_160) {
              std::
              vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
              ::resize(this_01,local_160 + 1);
              pRVar4 = (this_01->
                       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            }
            RefCntAutoPtr<Diligent::IShader>::operator=(pRVar4 + local_160,pRVar1[uVar8].m_pObject);
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_148);
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 8;
        } while (uVar8 < local_158.Count);
        bVar2 = true;
      }
    }
    else {
      FormatString<char[84]>
                ((string *)local_148,
                 (char (*) [84])
                 "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_148._0_8_,0,0,0);
      }
      uVar5 = local_148._16_8_;
      _Var6._M_p = (pointer)local_148._0_8_;
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
LAB_0046f9ec:
        operator_delete(_Var6._M_p,
                        (ulong)((long)&(((mutex *)uVar5)->super___mutex_base)._M_mutex + 1));
      }
LAB_0046f9f4:
      bVar2 = false;
    }
    DynamicLinearAllocator::~DynamicLinearAllocator(&local_58);
  }
  return bVar2;
}

Assistant:

bool DearchiverBase::UnpackPSOShaders(ArchiveData&             Archive,
                                      PSOData<CreateInfoType>& PSO,
                                      IRenderDevice*           pDevice)
{
    const auto& pObjArchive = Archive.pObjArchive;
    VERIFY_EXPR(pObjArchive);
    const DeviceType      DevType       = GetArchiveDeviceType(pDevice);
    const SerializedData& ShaderIdxData = pObjArchive->GetDeviceSpecificData(PSO.ArchiveResType, PSO.CreateInfo.PSODesc.Name, DevType);
    if (!ShaderIdxData)
        return false;

    DynamicLinearAllocator Allocator{GetRawAllocator()};

    DeviceObjectArchive::ShaderIndexArray ShaderIndices;
    {
        Serializer<SerializerMode::Read> Ser{ShaderIdxData};
        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &Allocator))
        {
            LOG_ERROR_MESSAGE("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
            return false;
        }
        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
    }

    ShaderCacheData& ShaderCache = Archive.CachedShaders[static_cast<size_t>(DevType)];

    PSO.Shaders.resize(ShaderIndices.Count);
    for (Uint32 i = 0; i < ShaderIndices.Count; ++i)
    {
        RefCntAutoPtr<IShader>& pShader{PSO.Shaders[i]};

        const Uint32 Idx = ShaderIndices.pIndices[i];

        {
            std::unique_lock<std::mutex> ReadLock{ShaderCache.Mtx};
            if (Idx < ShaderCache.Shaders.size())
            {
                // Try to get cached shader
                pShader = ShaderCache.Shaders[Idx];
                if (pShader)
                    continue;
            }
        }

        const SerializedData& SerializedShader = pObjArchive->GetSerializedShader(DevType, Idx);
        if (!SerializedShader)
            return false;

        {
            ShaderCreateInfo ShaderCI;
            {
                Serializer<SerializerMode::Read> ShaderSer{SerializedShader};
                if (!ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                {
                    LOG_ERROR_MESSAGE("Failed to deserialize shader create info. Archive file may be corrupted or invalid.");
                    return false;
                }
                VERIFY_EXPR(ShaderSer.IsEnded());
            }

            if ((PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) != 0)
                ShaderCI.CompileFlags |= SHADER_COMPILE_FLAG_SKIP_REFLECTION;

            pShader = UnpackShader(ShaderCI, pDevice);
            if (!pShader)
                return false;
        }

        // Add to the cache
        {
            std::unique_lock<std::mutex> WriteLock{ShaderCache.Mtx};
            if (Idx >= ShaderCache.Shaders.size())
                ShaderCache.Shaders.resize(size_t{Idx} + 1);
            ShaderCache.Shaders[Idx] = pShader;
        }
    }

    return true;
}